

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

Vector2i __thiscall
sf::RenderTarget::mapCoordsToPixel(RenderTarget *this,Vector2f *point,View *view)

{
  Vector2i VVar1;
  Vector2f VVar2;
  FloatRect viewport;
  Vector2f normalized;
  Vector2i pixel;
  Transform *in_stack_ffffffffffffffa8;
  IntRect local_48;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float local_28;
  float fStack_24;
  Vector2<int> local_8;
  
  View::getTransform((View *)viewport._0_8_);
  VVar2 = Transform::transformPoint(in_stack_ffffffffffffffa8,(Vector2f *)0x2c1d84);
  Vector2<int>::Vector2(&local_8);
  local_48 = getViewport((RenderTarget *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (View *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  Rect<float>::Rect<int>((Rect<float> *)&stack0xffffffffffffffc8,&local_48);
  local_28 = VVar2.x;
  fStack_24 = VVar2.y;
  VVar1.y = (int)(((-fStack_24 + 1.0) / 2.0) * in_stack_ffffffffffffffd4 + in_stack_ffffffffffffffcc
                 );
  VVar1.x = (int)(((local_28 + 1.0) / 2.0) * in_stack_ffffffffffffffd0 + in_stack_ffffffffffffffc8);
  return VVar1;
}

Assistant:

Vector2i RenderTarget::mapCoordsToPixel(const Vector2f& point, const View& view) const
{
    // First, transform the point by the view matrix
    Vector2f normalized = view.getTransform().transformPoint(point);

    // Then convert to viewport coordinates
    Vector2i pixel;
    FloatRect viewport = FloatRect(getViewport(view));
    pixel.x = static_cast<int>(( normalized.x + 1.f) / 2.f * viewport.width  + viewport.left);
    pixel.y = static_cast<int>((-normalized.y + 1.f) / 2.f * viewport.height + viewport.top);

    return pixel;
}